

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCondition::~IfcCondition(IfcCondition *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x98b188;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x98b200;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x98b1b0;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x98b1d8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcGroup).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar1 != &(this->super_IfcGroup).super_IfcObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x98b2a0;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x98b2c8;
  puVar1 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x60;
  if (puVar1 != &(this->super_IfcGroup).super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcGroup).super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcGroup).super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcGroup).super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcCondition() : Object("IfcCondition") {}